

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall google::protobuf::EnumValueOptions::EnumValueOptions(EnumValueOptions *this)

{
  EnumValueOptions *pEVar1;
  EnumValueOptions *this_local;
  
  Message::Message(&this->super_Message);
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__EnumValueOptions_00d60dd0;
  internal::ExtensionSet::ExtensionSet(&this->_extensions_);
  internal::InternalMetadataWithArena::InternalMetadataWithArena
            (&this->_internal_metadata_,(Arena *)0x0);
  memset(&this->_has_bits_,0,4);
  RepeatedPtrField<google::protobuf::UninterpretedOption>::RepeatedPtrField
            (&this->uninterpreted_option_);
  pEVar1 = internal_default_instance();
  if (this != pEVar1) {
    protobuf_google_2fprotobuf_2fdescriptor_2eproto::InitDefaults();
  }
  SharedCtor(this);
  return;
}

Assistant:

EnumValueOptions::EnumValueOptions()
  : ::google::protobuf::Message(), _internal_metadata_(NULL) {
  if (GOOGLE_PREDICT_TRUE(this != internal_default_instance())) {
    protobuf_google_2fprotobuf_2fdescriptor_2eproto::InitDefaults();
  }
  SharedCtor();
  // @@protoc_insertion_point(constructor:google.protobuf.EnumValueOptions)
}